

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpCommsSS.cpp
# Opt level: O0

int __thiscall helics::tcp::TcpCommsSS::processIncomingMessage(TcpCommsSS *this,ActionMessage *cmd)

{
  bool bVar1;
  long in_RSI;
  ActionMessage *in_RDI;
  ActionMessage *in_stack_ffffffffffffffd8;
  int local_4;
  
  bVar1 = isProtocolCommand(in_RDI);
  if ((bVar1) && (*(int *)(in_RSI + 4) == 0x16570bf)) {
    local_4 = -1;
  }
  else {
    std::function<void_(helics::ActionMessage_&&)>::operator()
              ((function<void_(helics::ActionMessage_&&)> *)in_RDI,in_stack_ffffffffffffffd8);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int TcpCommsSS::processIncomingMessage(ActionMessage&& cmd)
{
    if (isProtocolCommand(cmd)) {
        switch (cmd.messageID) {
            case CLOSE_RECEIVER:
                return (-1);
            default:
                break;
        }
    }
    ActionCallback(std::move(cmd));
    return 0;
}